

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

void __thiscall sf::Shader::bindTextures(Shader *this)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  socklen_t __len;
  ulong uVar3;
  
  if ((this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var2 = (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar3 = 0;
    do {
      uVar1 = uVar3 + 1;
      (*sf_glad_glUniform1iARB)(p_Var2[1]._M_color,(GLint)uVar1);
      (*sf_glad_glActiveTextureARB)((int)uVar3 + 0x84c1);
      Texture::bind((int)p_Var2[1]._M_parent,(sockaddr *)0x0,__len);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      uVar3 = uVar1;
    } while (uVar1 < (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  (*sf_glad_glActiveTextureARB)(0x84c0);
  return;
}

Assistant:

void Shader::bindTextures() const
{
    TextureTable::const_iterator it = m_textures.begin();
    for (std::size_t i = 0; i < m_textures.size(); ++i)
    {
        GLint index = static_cast<GLsizei>(i + 1);
        glCheck(GLEXT_glUniform1i(it->first, index));
        glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0 + static_cast<GLenum>(index)));
        Texture::bind(it->second);
        ++it;
    }

    // Make sure that the texture unit which is left active is the number 0
    glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0));
}